

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O3

error_code __thiscall
anon_unknown.dwarf_112f4::yaml_output::string_value(yaml_output *this,string *s)

{
  undefined1 auVar1 [16];
  string *psVar2;
  ulong uVar3;
  long in_RDX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  char *local_58;
  size_type local_50;
  char local_48;
  undefined7 uStack_47;
  undefined8 uStack_40;
  string *local_38;
  
  psVar2 = (string *)operator_new(0x30);
  local_58 = &local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,s,(long)&(s->_M_dataplus)._M_p + in_RDX);
  (psVar2->super_value)._vptr_value = (_func_int **)&PTR__string_00117708;
  paVar4 = &(psVar2->v_).field_2;
  (psVar2->v_)._M_dataplus._M_p = (pointer)paVar4;
  if (local_58 == &local_48) {
    paVar4->_M_allocated_capacity = CONCAT71(uStack_47,local_48);
    *(undefined8 *)((long)&(psVar2->v_).field_2 + 8) = uStack_40;
  }
  else {
    (psVar2->v_)._M_dataplus._M_p = local_58;
    (psVar2->v_).field_2._M_allocated_capacity = CONCAT71(uStack_47,local_48);
  }
  (psVar2->v_)._M_string_length = local_50;
  local_50 = 0;
  local_48 = '\0';
  psVar2->force_quoted_ = false;
  local_58 = &local_48;
  local_38 = psVar2;
  std::
  deque<std::shared_ptr<pstore::dump::value>,std::allocator<std::shared_ptr<pstore::dump::value>>>::
  emplace_back<pstore::dump::string*>
            ((deque<std::shared_ptr<pstore::dump::value>,std::allocator<std::shared_ptr<pstore::dump::value>>>
              *)this,&local_38);
  if (local_58 != &local_48) {
    operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
  }
  uVar3 = std::_V2::system_category();
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar3;
  return (error_code)(auVar1 << 0x40);
}

Assistant:

std::error_code yaml_output::string_value (std::string const & s) {
        out_.emplace (new pstore::dump::string (s));
        return {};
    }